

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_NumberOfExprPrecedence_Test::ExprWriterTest_NumberOfExprPrecedence_Test
          (ExprWriterTest_NumberOfExprPrecedence_Test *this)

{
  undefined8 *in_RDI;
  ExprWriterTest *in_stack_00000030;
  
  ExprWriterTest::ExprWriterTest(in_stack_00000030);
  *in_RDI = &PTR__ExprWriterTest_NumberOfExprPrecedence_Test_001ed4e0;
  in_RDI[2] = &PTR__ExprWriterTest_NumberOfExprPrecedence_Test_001ed520;
  return;
}

Assistant:

TEST_F(ExprWriterTest, NumberOfExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1);
  NumericExpr args[] = {MakeConst(42), x1, x2};
  auto e = MakeIterated(ex::NUMBEROF, args);
  NumericExpr args2[] = {e, e, e};
  CHECK_WRITE("numberof numberof 42 in (x1, x2) in ("
      "numberof 42 in (x1, x2), numberof 42 in (x1, x2))",
              MakeIterated(ex::NUMBEROF, args2));
  auto e2 = MakeBinary(ex::ADD, x1, x2);
  NumericExpr args3[] = {e2, e2, e2};
  CHECK_WRITE("numberof x1 + x2 in (x1 + x2, x1 + x2)",
              MakeIterated(ex::NUMBEROF, args3));
}